

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void ats_write64(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint8_t uVar1;
  uint64_t uVar2;
  ARMMMUIdx mmu_idx;
  ARMMMUIdx AVar3;
  bool bVar4;
  
  if ((env->features & 0x200000000) == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = ((env->cp15).scr_el3 & 1) == 0;
  }
  switch(ri->opc2 & 6) {
  case MMU_DATA_LOAD:
    uVar1 = ri->opc1;
    if (uVar1 == '\x06') {
      mmu_idx = ARMMMUIdx_SE3;
    }
    else {
      mmu_idx = ARMMMUIdx_E2;
      if (uVar1 != '\x04') {
        if (uVar1 != '\0') {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                     ,0xcac,(char *)0x0);
        }
        if ((ri->crm == '\t') && ((env->pstate & 0x400000) != 0)) {
          mmu_idx = (uint)(bVar4 ^ 1U) + (uint)(bVar4 ^ 1U) * 8 + ARMMMUIdx_SE10_1_PAN;
        }
        else {
          mmu_idx = (uint)(bVar4 ^ 1U) + (uint)(bVar4 ^ 1U) * 8 + ARMMMUIdx_SE10_1;
        }
      }
    }
    goto LAB_00620414;
  case MMU_INST_FETCH:
    mmu_idx = (uint)(bVar4 ^ 1U) + (uint)(bVar4 ^ 1U) * 8 + ARMMMUIdx_SE10_0;
    goto LAB_00620414;
  case 4:
    AVar3 = ARMMMUIdx_SE10_1;
    mmu_idx = ARMMMUIdx_E10_1;
    break;
  case 6:
    AVar3 = ARMMMUIdx_SE10_0;
    mmu_idx = ARMMMUIdx_E10_0;
  }
  if (bVar4 != false) {
    mmu_idx = AVar3;
  }
LAB_00620414:
  uVar2 = do_ats_write(env,value,ri->opc2 & MMU_DATA_STORE,mmu_idx);
  (env->cp15).field_26.field_0.par_ns = uVar2;
  return;
}

Assistant:

static void ats_write64(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    MMUAccessType access_type = ri->opc2 & 1 ? MMU_DATA_STORE : MMU_DATA_LOAD;
    ARMMMUIdx mmu_idx = 0;
    int secure = arm_is_secure_below_el3(env);

    switch (ri->opc2 & 6) {
    case 0:
        switch (ri->opc1) {
        case 0: /* AT S1E1R, AT S1E1W, AT S1E1RP, AT S1E1WP */
            if (ri->crm == 9 && (env->pstate & PSTATE_PAN)) {
                mmu_idx = (secure ? ARMMMUIdx_SE10_1_PAN
                           : ARMMMUIdx_Stage1_E1_PAN);
            } else {
                mmu_idx = secure ? ARMMMUIdx_SE10_1 : ARMMMUIdx_Stage1_E1;
            }
            break;
        case 4: /* AT S1E2R, AT S1E2W */
            mmu_idx = ARMMMUIdx_E2;
            break;
        case 6: /* AT S1E3R, AT S1E3W */
            mmu_idx = ARMMMUIdx_SE3;
            break;
        default:
            g_assert_not_reached();
            break;
        }
        break;
    case 2: /* AT S1E0R, AT S1E0W */
        mmu_idx = secure ? ARMMMUIdx_SE10_0 : ARMMMUIdx_Stage1_E0;
        break;
    case 4: /* AT S12E1R, AT S12E1W */
        mmu_idx = secure ? ARMMMUIdx_SE10_1 : ARMMMUIdx_E10_1;
        break;
    case 6: /* AT S12E0R, AT S12E0W */
        mmu_idx = secure ? ARMMMUIdx_SE10_0 : ARMMMUIdx_E10_0;
        break;
    default:
        g_assert_not_reached();
        break;
    }

    env->cp15.par_el[1] = do_ats_write(env, value, access_type, mmu_idx);
}